

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

bool __thiscall testing::internal::SharedPayloadBase::Unref(SharedPayloadBase *this)

{
  int iVar1;
  SharedPayloadBase *this_local;
  
  LOCK();
  iVar1 = (this->ref).super___atomic_base<int>._M_i;
  (this->ref).super___atomic_base<int>._M_i = (this->ref).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  return iVar1 == 1;
}

Assistant:

bool Unref() { return ref.fetch_sub(1, std::memory_order_acq_rel) == 1; }